

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

int f64_compare(float64 xa,float64 xb,_Bool is_quiet,float_status *s)

{
  double local_58;
  union_float64 ub;
  union_float64 ua;
  float_status *s_local;
  float64 fStack_38;
  _Bool is_quiet_local;
  float64 xb_local;
  float64 xa_local;
  float_status *local_20;
  double *local_18;
  union_float64 *local_10;
  
  local_10 = &ub;
  local_18 = &local_58;
  local_58 = (double)xb;
  ub.s = xa;
  ua = (union_float64)s;
  s_local._7_1_ = is_quiet;
  fStack_38 = xb;
  xb_local = xa;
  local_20 = s;
  if (s->flush_inputs_to_zero != '\0') {
    float64_input_flush__nocheck(&local_10->s,s);
    float64_input_flush__nocheck((float64 *)local_18,local_20);
  }
  if (ub.h < local_58) {
    if (local_58 <= ub.h) {
      xa_local._4_4_ =
           soft_f64_compare(ub.s,(float64)local_58,(_Bool)(s_local._7_1_ & 1),(float_status *)ua);
    }
    else {
      xa_local._4_4_ = -1;
    }
  }
  else if (ub.h <= local_58) {
    xa_local._4_4_ = 0;
  }
  else {
    xa_local._4_4_ = 1;
  }
  return xa_local._4_4_;
}

Assistant:

static int QEMU_FLATTEN
f64_compare(float64 xa, float64 xb, bool is_quiet, float_status *s)
{
    union_float64 ua, ub;

    ua.s = xa;
    ub.s = xb;

    if (QEMU_NO_HARDFLOAT) {
        goto soft;
    }

    float64_input_flush2(&ua.s, &ub.s, s);
    if (isgreaterequal(ua.h, ub.h)) {
        if (isgreater(ua.h, ub.h)) {
            return float_relation_greater;
        }
        return float_relation_equal;
    }
    if (likely(isless(ua.h, ub.h))) {
        return float_relation_less;
    }
    /* The only condition remaining is unordered.
     * Fall through to set flags.
     */
 soft:
    return soft_f64_compare(ua.s, ub.s, is_quiet, s);
}